

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

void Log::record_log(void)

{
  pointer pcVar1;
  bool bVar2;
  pointer pbVar3;
  uint uVar4;
  ulong uVar5;
  long *plVar6;
  ostream *poVar7;
  ulong uVar8;
  long *plVar9;
  ulong __val;
  pointer pbVar10;
  uint __len;
  string element;
  string __str;
  ofstream log;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,0x108480);
  uVar5 = time((time_t *)0x0);
  __val = -uVar5;
  if (0 < (long)uVar5) {
    __val = uVar5;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = __val;
    uVar4 = 4;
    do {
      __len = uVar4;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_00105716;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_00105716;
      }
      if (uVar8 < 10000) goto LAB_00105716;
      bVar2 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      uVar4 = __len + 4;
    } while (bVar2);
    __len = __len + 1;
  }
LAB_00105716:
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct((ulong)local_250,(char)__len - (char)((long)uVar5 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_250[0] + -((long)uVar5 >> 0x3f),__len,__val);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x10848c);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_260 = *plVar9;
    lStack_258 = plVar6[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *plVar9;
    local_270 = (long *)*plVar6;
  }
  local_268 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,(char *)local_270,local_268);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n\n",2);
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0]);
  }
  pbVar3 = records_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (records_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      records_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar10 = records_abi_cxx11_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar1 = (pbVar10->_M_dataplus)._M_p;
      local_270 = &local_260;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,pcVar1,pcVar1 + pbVar10->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,(char *)local_270,local_268);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\n-----------------------------------------------\n",0x31);
      if (local_270 != &local_260) {
        operator_delete(local_270);
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar3);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Log::record_log() {
    std::ofstream log = std::ofstream();
    log.open("LogFile.txt");
    log << "Log Data for " + std::to_string(time(0)) << "\n\n";
    for (std::string element : Log::records) {
        log << element;
        log << "\n-----------------------------------------------\n";
    }
    log.close();
}